

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O3

int64_t linearSpeedCurve(Simulator *sim,int64_t tt)

{
  int64_t iVar1;
  
  if (linearSpeedCurve(brown::Simulator&,long)::r2 == '\0') {
    linearSpeedCurve();
  }
  if (linearSpeedCurve(brown::Simulator&,long)::rv0 == '\0') {
    linearSpeedCurve();
  }
  if (linearSpeedCurve(brown::Simulator&,long)::a == '\0') {
    linearSpeedCurve();
  }
  if (linearSpeedCurve(brown::Simulator&,long)::lt == '\0') {
    linearSpeedCurve();
  }
  if (tt < linearSpeedCurve::lt) {
    iVar1 = (int64_t)sim->MAXT;
  }
  else {
    iVar1 = linearSpeedCurve::r2 /
            ((tt - linearSpeedCurve::lt) * linearSpeedCurve::a + linearSpeedCurve::rv0);
  }
  return iVar1;
}

Assistant:

std::int64_t linearSpeedCurve(brown::Simulator& sim, std::int64_t tt) {
    static std::int64_t r2 = sim.CLKFRQ * sim.CLKFRQ;
    static std::int64_t rv0 = sim.CLKFRQ * sim.MINVEL;
    static std::int64_t a = sim.MAXACC*4/5;
    static std::int64_t lt = sim.MAXT*2; // low speed period

    std::int64_t vt = 0;
    if (tt < lt) {
        vt = sim.MAXT;
    } else {
        vt = r2/(rv0 + a*(tt-lt));
    }
    return vt;
}